

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshglob.c
# Opt level: O0

void psh_blues_set_zones(PSH_Blues target,FT_UInt count,FT_Short *blues,FT_UInt count_others,
                        FT_Short *other_blues,FT_Int fuzz,FT_Int family)

{
  FT_UInt FVar1;
  FT_UInt FVar2;
  int iVar3;
  int iVar4;
  PSH_Blue_ZoneRec *local_88;
  PSH_Blue_Zone zone_2;
  FT_Int delta_2;
  FT_Int bot;
  FT_Int top;
  FT_Int dim;
  FT_Int delta_1;
  PSH_Blue_Zone zone_1;
  PSH_Blue_ZoneRec *pPStack_58;
  FT_Int delta;
  PSH_Blue_Zone zone;
  FT_UInt count_bot;
  FT_UInt count_top;
  PSH_Blue_Table bot_table;
  PSH_Blue_Table top_table;
  FT_Int fuzz_local;
  FT_Short *other_blues_local;
  FT_UInt count_others_local;
  FT_Short *blues_local;
  FT_UInt count_local;
  PSH_Blues target_local;
  
  if (family == 0) {
    _count_bot = &target->normal_bottom;
    bot_table = &target->normal_top;
  }
  else {
    bot_table = &target->family_top;
    _count_bot = &target->family_bottom;
  }
  bot_table->count = 0;
  _count_bot->count = 0;
  psh_blues_set_zones_0(target,'\0',count,blues,bot_table,_count_bot);
  psh_blues_set_zones_0(target,'\x01',count_others,other_blues,bot_table,_count_bot);
  FVar1 = bot_table->count;
  FVar2 = _count_bot->count;
  if (FVar1 != 0) {
    pPStack_58 = bot_table->zones;
    for (blues_local._4_4_ = FVar1; blues_local._4_4_ != 0;
        blues_local._4_4_ = blues_local._4_4_ - 1) {
      if ((1 < blues_local._4_4_) &&
         (iVar3 = pPStack_58[1].org_ref - pPStack_58->org_ref, iVar3 < pPStack_58->org_delta)) {
        pPStack_58->org_delta = iVar3;
      }
      pPStack_58->org_bottom = pPStack_58->org_ref;
      pPStack_58->org_top = pPStack_58->org_delta + pPStack_58->org_ref;
      pPStack_58 = pPStack_58 + 1;
    }
  }
  if (FVar2 != 0) {
    _dim = _count_bot->zones;
    for (blues_local._4_4_ = FVar2; blues_local._4_4_ != 0;
        blues_local._4_4_ = blues_local._4_4_ - 1) {
      if ((1 < blues_local._4_4_) &&
         (iVar3 = _dim->org_ref - _dim[1].org_ref, _dim->org_delta < iVar3)) {
        _dim->org_delta = iVar3;
      }
      _dim->org_top = _dim->org_ref;
      _dim->org_bottom = _dim->org_delta + _dim->org_ref;
      _dim = _dim + 1;
    }
  }
  blues_local._4_4_ = FVar1;
  for (bot = 1; local_88 = bot_table->zones, -1 < bot; bot = bot + -1) {
    if (blues_local._4_4_ != 0) {
      bot_table->zones[0].org_bottom = bot_table->zones[0].org_bottom - fuzz;
      delta_2 = bot_table->zones[0].org_top;
      while (blues_local._4_4_ = blues_local._4_4_ - 1, blues_local._4_4_ != 0) {
        iVar3 = local_88[1].org_bottom;
        iVar4 = iVar3 - delta_2;
        if (iVar4 / 2 < fuzz) {
          iVar3 = delta_2 + iVar4 / 2;
          local_88[1].org_bottom = iVar3;
          local_88->org_top = iVar3;
        }
        else {
          local_88->org_top = delta_2 + fuzz;
          local_88[1].org_bottom = iVar3 - fuzz;
        }
        delta_2 = local_88[1].org_top;
        local_88 = local_88 + 1;
      }
      local_88->org_top = delta_2 + fuzz;
    }
    blues_local._4_4_ = FVar2;
    bot_table = _count_bot;
  }
  return;
}

Assistant:

static void
  psh_blues_set_zones( PSH_Blues  target,
                       FT_UInt    count,
                       FT_Short*  blues,
                       FT_UInt    count_others,
                       FT_Short*  other_blues,
                       FT_Int     fuzz,
                       FT_Int     family )
  {
    PSH_Blue_Table  top_table, bot_table;
    FT_UInt         count_top, count_bot;


    if ( family )
    {
      top_table = &target->family_top;
      bot_table = &target->family_bottom;
    }
    else
    {
      top_table = &target->normal_top;
      bot_table = &target->normal_bottom;
    }

    /* read the input blue zones, and build two sorted tables  */
    /* (one for the top zones, the other for the bottom zones) */
    top_table->count = 0;
    bot_table->count = 0;

    /* first, the blues */
    psh_blues_set_zones_0( target, 0,
                           count, blues, top_table, bot_table );
    psh_blues_set_zones_0( target, 1,
                           count_others, other_blues, top_table, bot_table );

    count_top = top_table->count;
    count_bot = bot_table->count;

    /* sanitize top table */
    if ( count_top > 0 )
    {
      PSH_Blue_Zone  zone = top_table->zones;


      for ( count = count_top; count > 0; count--, zone++ )
      {
        FT_Int  delta;


        if ( count > 1 )
        {
          delta = zone[1].org_ref - zone[0].org_ref;
          if ( zone->org_delta > delta )
            zone->org_delta = delta;
        }

        zone->org_bottom = zone->org_ref;
        zone->org_top    = zone->org_delta + zone->org_ref;
      }
    }

    /* sanitize bottom table */
    if ( count_bot > 0 )
    {
      PSH_Blue_Zone  zone = bot_table->zones;


      for ( count = count_bot; count > 0; count--, zone++ )
      {
        FT_Int  delta;


        if ( count > 1 )
        {
          delta = zone[0].org_ref - zone[1].org_ref;
          if ( zone->org_delta < delta )
            zone->org_delta = delta;
        }

        zone->org_top    = zone->org_ref;
        zone->org_bottom = zone->org_delta + zone->org_ref;
      }
    }

    /* expand top and bottom tables with blue fuzz */
    {
      FT_Int         dim, top, bot, delta;
      PSH_Blue_Zone  zone;


      zone  = top_table->zones;
      count = count_top;

      for ( dim = 1; dim >= 0; dim-- )
      {
        if ( count > 0 )
        {
          /* expand the bottom of the lowest zone normally */
          zone->org_bottom -= fuzz;

          /* expand the top and bottom of intermediate zones;    */
          /* checking that the interval is smaller than the fuzz */
          top = zone->org_top;

          for ( count--; count > 0; count-- )
          {
            bot   = zone[1].org_bottom;
            delta = bot - top;

            if ( delta / 2 < fuzz )
              zone[0].org_top = zone[1].org_bottom = top + delta / 2;
            else
            {
              zone[0].org_top    = top + fuzz;
              zone[1].org_bottom = bot - fuzz;
            }

            zone++;
            top = zone->org_top;
          }

          /* expand the top of the highest zone normally */
          zone->org_top = top + fuzz;
        }
        zone  = bot_table->zones;
        count = count_bot;
      }
    }
  }